

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstandarditemmodel.cpp
# Opt level: O1

void __thiscall
QStandardItemPrivate::changeFlags(QStandardItemPrivate *this,bool enable,ItemFlags f)

{
  QStandardItem *this_00;
  uint uVar1;
  ItemFlags IVar2;
  undefined7 in_register_00000031;
  long in_FS_OFFSET;
  QVariant QStack_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this->q_ptr;
  IVar2 = QStandardItem::flags(this_00);
  uVar1 = ~(uint)f.super_QFlagsStorageHelper<Qt::ItemFlag,_4>.super_QFlagsStorage<Qt::ItemFlag>.i &
          (uint)IVar2.super_QFlagsStorageHelper<Qt::ItemFlag,_4>.super_QFlagsStorage<Qt::ItemFlag>.i
  ;
  if ((int)CONCAT71(in_register_00000031,enable) != 0) {
    uVar1 = (uint)IVar2.super_QFlagsStorageHelper<Qt::ItemFlag,_4>.super_QFlagsStorage<Qt::ItemFlag>
                  .i |
            (uint)f.super_QFlagsStorageHelper<Qt::ItemFlag,_4>.super_QFlagsStorage<Qt::ItemFlag>.i;
  }
  ::QVariant::QVariant(&QStack_48,uVar1);
  (*this_00->_vptr_QStandardItem[4])(this_00,&QStack_48,0xff);
  ::QVariant::~QVariant(&QStack_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QStandardItemPrivate::changeFlags(bool enable, Qt::ItemFlags f)
{
    Q_Q(QStandardItem);
    Qt::ItemFlags flags = q->flags();
    if (enable)
        flags |= f;
    else
        flags &= ~f;
    q->setFlags(flags);
}